

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicon.cpp
# Opt level: O2

void __thiscall
QPixmapIconEngine::addFile
          (QPixmapIconEngine *this,QString *fileName,QSize *size,Mode mode,State state)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  QSize QVar6;
  QSize QVar7;
  pointer pQVar8;
  ssize_t sVar9;
  undefined4 in_register_0000000c;
  QSize *__nbytes;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar10;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  QImage *i_1;
  QImage *image;
  long lVar11;
  uint uVar12;
  qsizetype i;
  ulong uVar13;
  long in_FS_OFFSET;
  QArrayDataPointer<QImage> local_108;
  QPixmapIconEngineEntry local_e8;
  undefined1 local_a8 [16];
  QImageData *local_98;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char16_t> local_68;
  undefined1 local_48 [16];
  long local_38;
  
  __nbytes = (QSize *)CONCAT44(in_register_0000000c,mode);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fileName->d).size != 0) {
    local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    cVar2 = QString::startsWith((QChar)(char16_t)fileName,0x3a);
    if (cVar2 == '\0') {
      QFileInfo::QFileInfo((QFileInfo *)&local_e8,(QString *)fileName);
      QFileInfo::absoluteFilePath();
      QFileInfo::~QFileInfo((QFileInfo *)&local_e8);
    }
    else {
      local_68.d = (fileName->d).d;
      local_68.ptr = (fileName->d).ptr;
      __nbytes = (QSize *)(fileName->d).size;
      local_68.size = (qsizetype)__nbytes;
      if (local_68.d != (Data *)0x0) {
        LOCK();
        ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    bVar1 = (byte)((uint)(size->ht).m_i >> 0x18) | (byte)((uint)(size->wd).m_i >> 0x18);
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    anon_unknown.dwarf_c9ed1::ImageReader::ImageReader((ImageReader *)local_48,(QString *)&local_68)
    ;
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QImageReader::format((QByteArray *)&local_88,(QImageReader *)local_48);
    if ((undefined1 *)local_88.size != (undefined1 *)0x0) {
      local_98 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_a8);
      local_e8.pixmap.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)0x5c3bc4;
      bVar3 = ::operator!=((QByteArray *)&local_88,(char **)&local_e8);
      if (bVar3) {
        if ((char)bVar1 < '\0') {
          bVar3 = anon_unknown.dwarf_c9ed1::ImageReader::supportsReadSize((ImageReader *)local_48);
          if (bVar3) {
            do {
              local_108.d = (Data *)QImageReader::size((QImageReader *)local_48);
              QPixmapIconEngineEntry::QPixmapIconEngineEntry
                        (&local_e8,(QString *)&local_68,(QSize *)&local_108,mode,state);
              QList<QPixmapIconEngineEntry>::emplaceBack<QPixmapIconEngineEntry>
                        (&this->pixmaps,&local_e8);
              QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&local_e8);
              bVar3 = QImageReader::jumpToNextImage((QImageReader *)local_48);
            } while (bVar3);
          }
          else {
            pvVar10 = extraout_RDX_00;
            while (sVar9 = anon_unknown.dwarf_c9ed1::ImageReader::read
                                     ((ImageReader *)local_48,(int)(QImage *)local_a8,pvVar10,
                                      (size_t)__nbytes), (char)sVar9 != '\0') {
              __nbytes = (QSize *)(ulong)mode;
              QPixmapIconEngineEntry::QPixmapIconEngineEntry
                        (&local_e8,(QString *)&local_68,(QImage *)local_a8,mode,state);
              QList<QPixmapIconEngineEntry>::emplaceBack<QPixmapIconEngineEntry>
                        (&this->pixmaps,&local_e8);
              QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&local_e8);
              pvVar10 = extraout_RDX_05;
            }
          }
        }
        else {
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    (&local_e8,(QString *)&local_68,size,mode,state);
          QList<QPixmapIconEngineEntry>::emplaceBack<QPixmapIconEngineEntry>
                    (&this->pixmaps,&local_e8);
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&local_e8);
        }
      }
      else {
        local_108.size = 0;
        local_108.d = (Data *)0x0;
        local_108.ptr = (QImage *)0x0;
        pvVar10 = extraout_RDX;
LAB_002593c9:
        sVar9 = anon_unknown.dwarf_c9ed1::ImageReader::read
                          ((ImageReader *)local_48,(int)(QImage *)local_a8,pvVar10,(size_t)__nbytes)
        ;
        if ((char)sVar9 != '\0') {
          if (((char)bVar1 < '\0') ||
             ((QVar6 = QImage::size((QImage *)local_a8), __nbytes = size, pvVar10 = extraout_RDX_01,
              (size->wd).m_i == QVar6.wd.m_i.m_i && ((size->ht).m_i == QVar6.ht.m_i.m_i)))) {
            QVar6 = QImage::size((QImage *)local_a8);
            lVar11 = 0;
            for (uVar13 = 0; uVar13 < (ulong)local_108.size; uVar13 = uVar13 + 1) {
              QVar7 = QImage::size((QImage *)
                                   ((long)&((local_108.ptr)->super_QPaintDevice)._vptr_QPaintDevice
                                   + lVar11));
              if (QVar6 == QVar7) {
                if (-1 < (int)(uint)uVar13) {
                  iVar4 = origIcoDepth((QImage *)local_a8);
                  uVar12 = (uint)uVar13 & 0x7fffffff;
                  iVar5 = origIcoDepth(local_108.ptr + uVar12);
                  pvVar10 = extraout_RDX_02;
                  if (iVar5 < iVar4) {
                    pQVar8 = QList<QImage>::data((QList<QImage> *)&local_108);
                    QImage::operator=(pQVar8 + uVar12,(QImage *)local_a8);
                    pvVar10 = extraout_RDX_03;
                  }
                  goto LAB_002593c9;
                }
                break;
              }
              lVar11 = lVar11 + 0x18;
            }
            QList<QImage>::emplaceBack<QImage_const&>
                      ((QList<QImage> *)&local_108,(QImage *)local_a8);
            pvVar10 = extraout_RDX_04;
          }
          goto LAB_002593c9;
        }
        image = local_108.ptr;
        for (lVar11 = local_108.size * 0x18; lVar11 != 0; lVar11 = lVar11 + -0x18) {
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    (&local_e8,(QString *)&local_68,image,mode,state);
          QList<QPixmapIconEngineEntry>::emplaceBack<QPixmapIconEngineEntry>
                    (&this->pixmaps,&local_e8);
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&local_e8);
          image = image + 1;
        }
        if (-1 < (char)bVar1 && local_108.size == 0) {
          QPixmapIconEngineEntry::QPixmapIconEngineEntry
                    (&local_e8,(QString *)&local_68,size,mode,state);
          QList<QPixmapIconEngineEntry>::emplaceBack<QPixmapIconEngineEntry>
                    (&this->pixmaps,&local_e8);
          QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&local_e8);
        }
        QArrayDataPointer<QImage>::~QArrayDataPointer(&local_108);
      }
      QImage::~QImage((QImage *)local_a8);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    QImageReader::~QImageReader((QImageReader *)local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapIconEngine::addFile(const QString &fileName, const QSize &size, QIcon::Mode mode, QIcon::State state)
{
    if (fileName.isEmpty())
        return;
    const QString abs = fileName.startsWith(u':') ? fileName : QFileInfo(fileName).absoluteFilePath();
    const bool ignoreSize = !size.isValid();
    ImageReader imageReader(abs);
    const QByteArray format = imageReader.format();
    if (format.isEmpty()) // Device failed to open or unsupported format.
        return;
    QImage image;
    if (format != "ico") {
        if (ignoreSize) { // No size specified: Add all images.
            if (imageReader.supportsReadSize()) {
                do {
                    pixmaps += QPixmapIconEngineEntry(abs, imageReader.size(), mode, state);
                } while (imageReader.jumpToNextImage());
            } else {
                while (imageReader.read(&image))
                    pixmaps += QPixmapIconEngineEntry(abs, image, mode, state);
            }
        } else {
            pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
        }
        return;
    }
    // Special case for reading Windows ".ico" files. Historically (QTBUG-39287),
    // these files may contain low-resolution images. As this information is lost,
    // ICOReader sets the original format as an image text key value. Read all matching
    // images into a list trying to find the highest quality per size.
    QList<QImage> icoImages;
    while (imageReader.read(&image)) {
        if (ignoreSize || image.size() == size) {
            const int position = findBySize(icoImages, image.size());
            if (position >= 0) { // Higher quality available? -> replace.
                if (origIcoDepth(image) > origIcoDepth(icoImages.at(position)))
                    icoImages[position] = image;
            } else {
                icoImages.append(image);
            }
        }
    }
    for (const QImage &i : std::as_const(icoImages))
        pixmaps += QPixmapIconEngineEntry(abs, i, mode, state);
    if (icoImages.isEmpty() && !ignoreSize) // Add placeholder with the filename and empty pixmap for the size.
        pixmaps += QPixmapIconEngineEntry(abs, size, mode, state);
}